

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O3

void __thiscall CTcMake::add_module(CTcMake *this,CTcMakeModule *mod)

{
  CTcMakeModule *pCVar1;
  
  pCVar1 = (CTcMakeModule *)&this->mod_head_;
  if (this->mod_tail_ != (CTcMakeModule *)0x0) {
    pCVar1 = this->mod_tail_;
  }
  pCVar1->nxt_ = mod;
  this->mod_tail_ = mod;
  mod->nxt_ = (CTcMakeModule *)0x0;
  return;
}

Assistant:

void CTcMake::add_module(CTcMakeModule *mod)
{
    /* add it at the end of our list */
    if (mod_tail_ != 0)
        mod_tail_->set_next(mod);
    else
        mod_head_ = mod;
    mod_tail_ = mod;
    mod->set_next(0);
}